

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_wav_init(ma_read_proc onRead,ma_seek_proc onSeek,ma_tell_proc onTell,
                     void *pReadSeekTellUserData,ma_decoding_backend_config *pConfig,
                     ma_allocation_callbacks *pAllocationCallbacks,ma_wav *pWav)

{
  ma_result mVar1;
  ma_bool32 mVar2;
  
  mVar1 = ma_wav_init_internal(pConfig,pWav);
  if ((mVar1 == MA_SUCCESS) &&
     (mVar1 = MA_INVALID_ARGS, onSeek != (ma_seek_proc)0x0 && onRead != (ma_read_proc)0x0)) {
    pWav->onRead = onRead;
    pWav->onSeek = onSeek;
    pWav->onTell = onTell;
    pWav->pReadSeekTellUserData = pReadSeekTellUserData;
    mVar2 = ma_dr_wav_init(&pWav->dr,ma_wav_dr_callback__read,ma_wav_dr_callback__seek,pWav,
                           pAllocationCallbacks);
    if (mVar2 == 0) {
      mVar1 = MA_INVALID_FILE;
    }
    else {
      ma_wav_post_init(pWav);
      mVar1 = MA_SUCCESS;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_wav_init(ma_read_proc onRead, ma_seek_proc onSeek, ma_tell_proc onTell, void* pReadSeekTellUserData, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_wav* pWav)
{
    ma_result result;

    result = ma_wav_init_internal(pConfig, pWav);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (onRead == NULL || onSeek == NULL) {
        return MA_INVALID_ARGS; /* onRead and onSeek are mandatory. */
    }

    pWav->onRead = onRead;
    pWav->onSeek = onSeek;
    pWav->onTell = onTell;
    pWav->pReadSeekTellUserData = pReadSeekTellUserData;

    #if !defined(MA_NO_WAV)
    {
        ma_bool32 wavResult;

        wavResult = ma_dr_wav_init(&pWav->dr, ma_wav_dr_callback__read, ma_wav_dr_callback__seek, pWav, pAllocationCallbacks);
        if (wavResult != MA_TRUE) {
            return MA_INVALID_FILE;
        }

        ma_wav_post_init(pWav);

        return MA_SUCCESS;
    }
    #else
    {
        /* wav is disabled. */
        (void)pAllocationCallbacks;
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}